

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char *txt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type *psVar3;
  string *this_00;
  allocator local_b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_58;
  string local_38;
  
  if (this == (lest *)0x0) {
    std::__cxx11::string::string((string *)&local_98,"{null string}",(allocator *)&local_58);
    sVar2 = local_98._M_string_length;
    paVar1 = &local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      local_68._8_8_ = local_98.field_2._8_8_;
      local_58._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_98._M_dataplus._M_p;
      local_58._M_dataplus._M_p = local_98._M_dataplus._M_p;
    }
    local_68._M_allocated_capacity._1_7_ = local_98.field_2._M_allocated_capacity._1_7_;
    local_68._M_local_buf[0] = local_98.field_2._M_local_buf[0];
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_58._M_dataplus._M_p = (pointer)&local_a8;
      local_a8._8_8_ = local_68._8_8_;
    }
    local_a8._M_allocated_capacity = local_68._M_allocated_capacity;
    psVar3 = &local_70;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(char *)this,&local_b9);
    make_strg_string(&local_58,&local_38);
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_a8._8_8_ = local_58.field_2._8_8_;
      local_58._M_dataplus._M_p = (pointer)&local_a8;
    }
    local_a8._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    psVar3 = &local_58._M_string_length;
    sVar2 = local_58._M_string_length;
  }
  (((string *)(psVar3 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
  *psVar3 = 0;
  paVar1->_M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_b8 = &local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == local_b8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_a8._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_a8._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_a8._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar2;
  local_b0 = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::~string((string *)&local_b8);
  if (this == (lest *)0x0) {
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_98;
  }
  else {
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( char    const * const   txt ) { return txt ? make_strg_string( txt ) : "{null string}"; }